

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSynth.cpp
# Opt level: O2

void __thiscall QSynth::~QSynth(QSynth *this)

{
  SampleRateConverter *this_00;
  Synth *this_01;
  QMutex *pQVar1;
  
  *(undefined ***)this = &PTR_metaObject_001a7408;
  freeROMImages(this);
  if (this->realtimeHelper != (RealtimeHelper *)0x0) {
    (**(code **)(*(long *)this->realtimeHelper + 0x20))();
  }
  if (this->audioRecorder != (AudioFileWriter *)0x0) {
    (*this->audioRecorder->_vptr_AudioFileWriter[1])();
  }
  this_00 = this->sampleRateConverter;
  if (this_00 != (SampleRateConverter *)0x0) {
    MT32Emu::SampleRateConverter::~SampleRateConverter(this_00);
  }
  operator_delete(this_00,0x18);
  this_01 = this->synth;
  if (this_01 != (Synth *)0x0) {
    MT32Emu::Synth::~Synth(this_01);
  }
  operator_delete(this_01,0x101e8);
  pQVar1 = this->synthMutex;
  if (pQVar1 != (QMutex *)0x0) {
    QMutex::~QMutex(pQVar1);
  }
  operator_delete(pQVar1,8);
  pQVar1 = this->midiMutex;
  if (pQVar1 != (QMutex *)0x0) {
    QMutex::~QMutex(pQVar1);
  }
  operator_delete(pQVar1,8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->synthProfileName).d);
  QObject::~QObject(&(this->reportHandler).super_QObject);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->pcmROMFileName2).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->pcmROMFileName).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->controlROMFileName2).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->controlROMFileName).d);
  QDir::~QDir(&this->romDir);
  QObject::~QObject(&this->super_QObject);
  return;
}

Assistant:

QSynth::~QSynth() {
	freeROMImages();
	delete realtimeHelper;
	delete audioRecorder;
	delete sampleRateConverter;
	delete synth;
	delete synthMutex;
	delete midiMutex;
}